

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnMemory
          (BinaryReaderInterp *this,Index index,Limits *limits)

{
  ModuleDesc *pMVar1;
  bool bVar2;
  MemoryType local_98;
  uint64_t local_70;
  uint64_t local_68;
  undefined8 local_60;
  undefined1 local_58 [8];
  MemoryType memory_type;
  Limits *limits_local;
  Index index_local;
  BinaryReaderInterp *this_local;
  
  memory_type.limits._20_4_ =
       SharedValidator::OnMemory
                 (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,
                  limits);
  bVar2 = Failed((Result)memory_type.limits._20_4_);
  if (bVar2) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    local_70 = limits->initial;
    local_68 = limits->max;
    local_60._0_1_ = limits->has_max;
    local_60._1_1_ = limits->is_shared;
    local_60._2_6_ = *(undefined6 *)&limits->field_0x12;
    MemoryType::MemoryType((MemoryType *)local_58,*limits);
    pMVar1 = this->module_;
    MemoryType::MemoryType(&local_98,(MemoryType *)local_58);
    std::vector<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>::push_back
              (&pMVar1->memories,(value_type *)&local_98);
    MemoryDesc::~MemoryDesc((MemoryDesc *)&local_98);
    std::vector<wabt::interp::MemoryType,_std::allocator<wabt::interp::MemoryType>_>::push_back
              (&this->memory_types_,(value_type *)local_58);
    Result::Result((Result *)((long)&this_local + 4),Ok);
    MemoryType::~MemoryType((MemoryType *)local_58);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnMemory(Index index, const Limits* limits) {
  CHECK_RESULT(validator_.OnMemory(loc, *limits));
  MemoryType memory_type{*limits};
  module_.memories.push_back(MemoryDesc{memory_type});
  memory_types_.push_back(memory_type);
  return Result::Ok;
}